

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLUri::initialize(XMLUri *this,XMLUri *toCopy)

{
  short *psVar1;
  XMLCh *pXVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  MemoryManager *pMVar5;
  size_t sVar6;
  XMLCh *pXVar4;
  
  pMVar5 = toCopy->fMemoryManager;
  this->fMemoryManager = pMVar5;
  pXVar2 = toCopy->fScheme;
  if (pXVar2 == (XMLCh *)0x0) {
    pXVar4 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar2 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar3 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,sVar6);
    pXVar4 = (XMLCh *)CONCAT44(extraout_var,iVar3);
    memcpy(pXVar4,pXVar2,sVar6);
    pMVar5 = this->fMemoryManager;
  }
  this->fScheme = pXVar4;
  pXVar2 = toCopy->fUserInfo;
  if (pXVar2 == (XMLCh *)0x0) {
    pXVar4 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar2 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar3 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,sVar6);
    pXVar4 = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
    memcpy(pXVar4,pXVar2,sVar6);
    pMVar5 = this->fMemoryManager;
  }
  this->fUserInfo = pXVar4;
  pXVar2 = toCopy->fHost;
  if (pXVar2 == (XMLCh *)0x0) {
    pXVar4 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar2 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar3 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,sVar6);
    pXVar4 = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
    memcpy(pXVar4,pXVar2,sVar6);
    pMVar5 = this->fMemoryManager;
  }
  this->fHost = pXVar4;
  this->fPort = toCopy->fPort;
  pXVar2 = toCopy->fRegAuth;
  if (pXVar2 == (XMLCh *)0x0) {
    pXVar4 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar2 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar3 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,sVar6);
    pXVar4 = (XMLCh *)CONCAT44(extraout_var_02,iVar3);
    memcpy(pXVar4,pXVar2,sVar6);
    pMVar5 = this->fMemoryManager;
  }
  this->fRegAuth = pXVar4;
  pXVar2 = toCopy->fPath;
  if (pXVar2 == (XMLCh *)0x0) {
    pXVar4 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar2 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar3 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,sVar6);
    pXVar4 = (XMLCh *)CONCAT44(extraout_var_03,iVar3);
    memcpy(pXVar4,pXVar2,sVar6);
    pMVar5 = this->fMemoryManager;
  }
  this->fPath = pXVar4;
  pXVar2 = toCopy->fQueryString;
  if (pXVar2 == (XMLCh *)0x0) {
    pXVar4 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar2 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar3 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,sVar6);
    pXVar4 = (XMLCh *)CONCAT44(extraout_var_04,iVar3);
    memcpy(pXVar4,pXVar2,sVar6);
    pMVar5 = this->fMemoryManager;
  }
  this->fQueryString = pXVar4;
  pXVar2 = toCopy->fFragment;
  if (pXVar2 == (XMLCh *)0x0) {
    pXVar4 = (XMLCh *)0x0;
  }
  else {
    sVar6 = 0;
    do {
      psVar1 = (short *)((long)pXVar2 + sVar6);
      sVar6 = sVar6 + 2;
    } while (*psVar1 != 0);
    iVar3 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,sVar6);
    pXVar4 = (XMLCh *)CONCAT44(extraout_var_05,iVar3);
    memcpy(pXVar4,pXVar2,sVar6);
  }
  this->fFragment = pXVar4;
  return;
}

Assistant:

void XMLUri::initialize(const XMLUri& toCopy)
{
    //
    // assuming that all fields from the toCopy are valid,
    // therefore need NOT to go through various setXXX() methods
    //
    fMemoryManager = toCopy.fMemoryManager;
    fScheme = XMLString::replicate(toCopy.fScheme, fMemoryManager);
    fUserInfo = XMLString::replicate(toCopy.fUserInfo, fMemoryManager);
    fHost = XMLString::replicate(toCopy.fHost, fMemoryManager);
    fPort = toCopy.fPort;
    fRegAuth = XMLString::replicate(toCopy.fRegAuth, fMemoryManager);
    fPath = XMLString::replicate(toCopy.fPath, fMemoryManager);
    fQueryString = XMLString::replicate(toCopy.fQueryString, fMemoryManager);
    fFragment = XMLString::replicate(toCopy.fFragment, fMemoryManager);
}